

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

uchar * LoadFileData(char *fileName,uint *bytesRead)

{
  uchar *puVar1;
  FILE *__stream;
  long lVar2;
  size_t sVar3;
  char *text;
  int logType;
  uint uVar4;
  
  *bytesRead = 0;
  if (fileName == (char *)0x0) {
    TraceLog(4,"FILEIO: File name provided is not valid");
    return (uchar *)0x0;
  }
  if (loadFileData != (LoadFileDataCallback)0x0) {
    puVar1 = (*loadFileData)(fileName,bytesRead);
    return puVar1;
  }
  __stream = fopen(fileName,"rb");
  if (__stream == (FILE *)0x0) {
    TraceLog(4,"FILEIO: [%s] Failed to open file",fileName);
    return (uchar *)0x0;
  }
  fseek(__stream,0,2);
  lVar2 = ftell(__stream);
  fseek(__stream,0,0);
  uVar4 = (uint)lVar2;
  if ((int)uVar4 < 1) {
    text = "FILEIO: [%s] Failed to read file";
    puVar1 = (uchar *)0x0;
  }
  else {
    puVar1 = (uchar *)malloc((ulong)(uVar4 & 0x7fffffff));
    sVar3 = fread(puVar1,1,(ulong)(uVar4 & 0x7fffffff),__stream);
    *bytesRead = (uint)sVar3;
    if ((uint)sVar3 == uVar4) {
      text = "FILEIO: [%s] File loaded successfully";
      logType = 3;
      goto LAB_0014d824;
    }
    text = "FILEIO: [%s] File partially loaded";
  }
  logType = 4;
LAB_0014d824:
  TraceLog(logType,text,fileName);
  fclose(__stream);
  return puVar1;
}

Assistant:

unsigned char *LoadFileData(const char *fileName, unsigned int *bytesRead)
{
    unsigned char *data = NULL;
    *bytesRead = 0;

    if (fileName != NULL)
    {
        if (loadFileData)
        {
            data = loadFileData(fileName, bytesRead);
            return data;
        }
#if defined(SUPPORT_STANDARD_FILEIO)
        FILE *file = fopen(fileName, "rb");

        if (file != NULL)
        {
            // WARNING: On binary streams SEEK_END could not be found,
            // using fseek() and ftell() could not work in some (rare) cases
            fseek(file, 0, SEEK_END);
            int size = ftell(file);
            fseek(file, 0, SEEK_SET);

            if (size > 0)
            {
                data = (unsigned char *)RL_MALLOC(size*sizeof(unsigned char));

                // NOTE: fread() returns number of read elements instead of bytes, so we read [1 byte, size elements]
                unsigned int count = (unsigned int)fread(data, sizeof(unsigned char), size, file);
                *bytesRead = count;

                if (count != size) TRACELOG(LOG_WARNING, "FILEIO: [%s] File partially loaded", fileName);
                else TRACELOG(LOG_INFO, "FILEIO: [%s] File loaded successfully", fileName);
            }
            else TRACELOG(LOG_WARNING, "FILEIO: [%s] Failed to read file", fileName);

            fclose(file);
        }
        else TRACELOG(LOG_WARNING, "FILEIO: [%s] Failed to open file", fileName);
#else
    TRACELOG(LOG_WARNING, "FILEIO: Standard file io not supported, use custom file callback");
#endif
    }
    else TRACELOG(LOG_WARNING, "FILEIO: File name provided is not valid");

    return data;
}